

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O2

void ShiftRows(AES_state *s)

{
  ushort uVar1;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    uVar1 = s->slice[lVar2];
    s->slice[lVar2] =
         uVar1 >> 3 & 0x1000 |
         (uVar1 >> 2 & 0x300 |
         (uVar1 >> 1 & 0x70 | (uVar1 & 0xf) + (uVar1 & 0x10) * 8) + (uVar1 & 0x300) * 4) +
         (uVar1 & 0xf000) * 2;
  }
  return;
}

Assistant:

static void ShiftRows(AES_state* s) {
    int i;
    for (i = 0; i < 8; i++) {
        uint16_t v = s->slice[i];
        s->slice[i] =
            (v & BIT_RANGE(0, 4)) |
            BIT_RANGE_LEFT(v, 4, 5, 3) | BIT_RANGE_RIGHT(v, 5, 8, 1) |
            BIT_RANGE_LEFT(v, 8, 10, 2) | BIT_RANGE_RIGHT(v, 10, 12, 2) |
            BIT_RANGE_LEFT(v, 12, 15, 1) | BIT_RANGE_RIGHT(v, 15, 16, 3);
    }
}